

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArray.cpp
# Opt level: O0

void __thiscall CompressedArray::add_key(CompressedArray *this,Key key,Key prev_key,bool same_word)

{
  byte in_CL;
  CompressedArray *in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  uint32_t number;
  
  if ((in_CL & 1) == 0) {
    add_number(in_RDX,(uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
  }
  number = (uint32_t)((ulong)in_RDI >> 0x20);
  if (in_ESI == (int)in_RDX) {
    add_number(in_RDX,number,(uint32_t)in_RDI);
  }
  else {
    add_number(in_RDX,number,(uint32_t)in_RDI);
  }
  return;
}

Assistant:

void CompressedArray::add_key(Key key, Key prev_key, bool same_word) {
    if (!same_word)
        add_number(key.word_index - prev_key.word_index, word_index_diff_log_radix);
    if (key.word_index != prev_key.word_index)
        add_number(key.context_index, context_index_log_radix);
    else
        add_number(key.context_index - prev_key.context_index, context_index_diff_log_radix);
}